

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-xml-cpp.cpp
# Opt level: O0

bool string_equals(xml_string *a,char *b)

{
  size_t length;
  size_t sVar1;
  uchar *buffer;
  ostream *poVar2;
  ulong local_40;
  size_t i;
  uint8_t *a_buffer;
  size_t b_length;
  size_t a_length;
  char *b_local;
  xml_string *a_local;
  
  length = xml_string_length(a);
  sVar1 = strlen(b);
  buffer = (uchar *)operator_new__(length + 1);
  xml_string_copy(a,buffer,length);
  buffer[length] = '\0';
  if (length == sVar1) {
    for (local_40 = 0; local_40 < length; local_40 = local_40 + 1) {
      if ((uint)buffer[local_40] != (int)b[local_40]) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"string_equals: ");
        poVar2 = std::operator<<(poVar2,buffer);
        poVar2 = std::operator<<(poVar2," <> ");
        poVar2 = std::operator<<(poVar2,b);
        std::operator<<(poVar2,"\n");
        if (buffer != (uchar *)0x0) {
          operator_delete__(buffer);
        }
        return false;
      }
    }
    if (buffer != (uchar *)0x0) {
      operator_delete__(buffer);
    }
    a_local._7_1_ = true;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"string_equals: ");
    poVar2 = std::operator<<(poVar2,buffer);
    poVar2 = std::operator<<(poVar2,"#");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,length);
    poVar2 = std::operator<<(poVar2," <> ");
    poVar2 = std::operator<<(poVar2,b);
    poVar2 = std::operator<<(poVar2,"#");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar1);
    std::operator<<(poVar2,"\n");
    if (buffer != (uchar *)0x0) {
      operator_delete__(buffer);
    }
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

static bool string_equals(struct xml_string* a, const char* b) {
	size_t a_length = xml_string_length(a);
	size_t b_length = strlen(b);
	uint8_t* a_buffer = new uint8_t[((a_length + 1) * sizeof(uint8_t))];
	xml_string_copy(a, a_buffer, a_length);
	a_buffer[a_length] = 0;
	if (a_length != b_length) {
		std::cerr << "string_equals: " << a_buffer << "#" << a_length << " <> "
		  << b << "#" << b_length << "\n";
		delete[] a_buffer;
		return false;
	}
	size_t i = 0; for (; i < a_length; ++i) {
		if (a_buffer[i] != b[i]) {
			std::cerr << "string_equals: " << a_buffer << " <> " << b << "\n";
			delete[] a_buffer;
			return false;
		}
	}
	delete[] a_buffer;
	return true;
}